

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

bool duckdb::FromCStringCastWrapper<duckdb::TryCast>::Operation<char*,duckdb::dtime_t>
               (char *input_str,dtime_t *result)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  undefined1 in_R8B;
  string_t input_00;
  string_t input;
  undefined4 uStack_1c;
  undefined8 uStack_18;
  
  sVar3 = strlen(input_str);
  uVar2 = (uint)sVar3;
  if (uVar2 < 0xd) {
    uStack_18._4_4_ = 0;
    uStack_1c = 0;
    uStack_18._0_4_ = 0;
    uStack_18 = (char *)0x0;
    if (uVar2 != 0) {
      switchD_012e1ce8::default(&uStack_1c,input_str,(ulong)(uVar2 & 0xf));
      uStack_18 = (char *)CONCAT44(uStack_18._4_4_,(undefined4)uStack_18);
    }
  }
  else {
    uStack_1c = *(undefined4 *)input_str;
    uStack_18 = input_str;
  }
  input_00.value.pointer.ptr = (char *)result;
  input_00.value._0_8_ = uStack_18;
  bVar1 = TryCast::Operation<duckdb::string_t,duckdb::dtime_t>
                    ((TryCast *)CONCAT44(uStack_1c,uVar2),input_00,(dtime_t *)0x0,(bool)in_R8B);
  return bVar1;
}

Assistant:

static bool Operation(SOURCE_TYPE input_str, RESULT_TYPE &result) {
		string_t input(input_str);
		return OP::template Operation<string_t, RESULT_TYPE>(input, result);
	}